

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000189010 = 0x2d2d2d2d2d2d2d;
    uRam0000000000189017._0_1_ = '-';
    uRam0000000000189017._1_1_ = '-';
    uRam0000000000189017._2_1_ = '-';
    uRam0000000000189017._3_1_ = '-';
    uRam0000000000189017._4_1_ = '-';
    uRam0000000000189017._5_1_ = '-';
    uRam0000000000189017._6_1_ = '-';
    uRam0000000000189017._7_1_ = '-';
    DAT_00189000 = '-';
    DAT_00189000_1._0_1_ = '-';
    DAT_00189000_1._1_1_ = '-';
    DAT_00189000_1._2_1_ = '-';
    DAT_00189000_1._3_1_ = '-';
    DAT_00189000_1._4_1_ = '-';
    DAT_00189000_1._5_1_ = '-';
    DAT_00189000_1._6_1_ = '-';
    uRam0000000000189008 = 0x2d2d2d2d2d2d2d;
    DAT_0018900f = 0x2d;
    DAT_00188ff0 = '-';
    DAT_00188ff0_1._0_1_ = '-';
    DAT_00188ff0_1._1_1_ = '-';
    DAT_00188ff0_1._2_1_ = '-';
    DAT_00188ff0_1._3_1_ = '-';
    DAT_00188ff0_1._4_1_ = '-';
    DAT_00188ff0_1._5_1_ = '-';
    DAT_00188ff0_1._6_1_ = '-';
    uRam0000000000188ff8._0_1_ = '-';
    uRam0000000000188ff8._1_1_ = '-';
    uRam0000000000188ff8._2_1_ = '-';
    uRam0000000000188ff8._3_1_ = '-';
    uRam0000000000188ff8._4_1_ = '-';
    uRam0000000000188ff8._5_1_ = '-';
    uRam0000000000188ff8._6_1_ = '-';
    uRam0000000000188ff8._7_1_ = '-';
    DAT_00188fe0 = '-';
    DAT_00188fe0_1._0_1_ = '-';
    DAT_00188fe0_1._1_1_ = '-';
    DAT_00188fe0_1._2_1_ = '-';
    DAT_00188fe0_1._3_1_ = '-';
    DAT_00188fe0_1._4_1_ = '-';
    DAT_00188fe0_1._5_1_ = '-';
    DAT_00188fe0_1._6_1_ = '-';
    uRam0000000000188fe8._0_1_ = '-';
    uRam0000000000188fe8._1_1_ = '-';
    uRam0000000000188fe8._2_1_ = '-';
    uRam0000000000188fe8._3_1_ = '-';
    uRam0000000000188fe8._4_1_ = '-';
    uRam0000000000188fe8._5_1_ = '-';
    uRam0000000000188fe8._6_1_ = '-';
    uRam0000000000188fe8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000188fd8._0_1_ = '-';
    uRam0000000000188fd8._1_1_ = '-';
    uRam0000000000188fd8._2_1_ = '-';
    uRam0000000000188fd8._3_1_ = '-';
    uRam0000000000188fd8._4_1_ = '-';
    uRam0000000000188fd8._5_1_ = '-';
    uRam0000000000188fd8._6_1_ = '-';
    uRam0000000000188fd8._7_1_ = '-';
    DAT_0018901f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}